

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::anon_unknown_1::getUniformName
                   (string *__return_storage_ptr__,string *name,int declNdx)

{
  string local_40;
  int local_1c;
  string *psStack_18;
  int declNdx_local;
  string *name_local;
  
  local_1c = declNdx;
  psStack_18 = name;
  name_local = __return_storage_ptr__;
  de::toString<int>(&local_40,&local_1c);
  std::operator+(__return_storage_ptr__,name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getUniformName (const std::string& name, int declNdx)
{
	return name + de::toString(declNdx);
}